

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CodeDropTable(Parse *pParse,Table *pTab,int iDb,int isView)

{
  uint uVar1;
  uint uVar2;
  sqlite3 *db;
  Db *pDVar3;
  char *pcVar4;
  u8 uVar5;
  uint uVar6;
  Vdbe *p;
  Trigger *pTrigger;
  Parse *pPVar7;
  Schema *pSVar8;
  ushort uVar9;
  Index *pIVar10;
  Schema **ppSVar11;
  int iVar12;
  uint uVar13;
  uint iTable;
  HashElem *pHVar14;
  
  db = pParse->db;
  pDVar3 = db->aDb;
  p = sqlite3GetVdbe(pParse);
  sqlite3BeginWriteOperation(pParse,1,iDb);
  if (pTab->eTabType == '\x01') {
    sqlite3VdbeAddOp3(p,0xaa,0,0,0);
  }
  for (pTrigger = sqlite3TriggerList((Parse *)pParse->db->aDb[1].pSchema,pTab);
      pTrigger != (Trigger *)0x0; pTrigger = pTrigger->pNext) {
    sqlite3DropTriggerPtr(pParse,pTrigger);
  }
  if ((pTab->tabFlags & 8) != 0) {
    sqlite3NestedParse(pParse,"DELETE FROM %Q.sqlite_sequence WHERE name=%Q",pDVar3[iDb].zDbSName,
                       pTab->zName);
  }
  sqlite3NestedParse(pParse,"DELETE FROM %Q.sqlite_master WHERE tbl_name=%Q and type!=\'trigger\'",
                     pDVar3[iDb].zDbSName);
  uVar5 = pTab->eTabType;
  if (isView == 0) {
    if (uVar5 != '\x01') {
      uVar1 = pTab->tnum;
      iTable = 0;
      while( true ) {
        uVar6 = iTable - 1;
        iTable = uVar1;
        if (uVar6 < uVar1) {
          iTable = 0;
        }
        for (pIVar10 = pTab->pIndex; pIVar10 != (Index *)0x0; pIVar10 = pIVar10->pNext) {
          uVar2 = pIVar10->tnum;
          uVar13 = iTable;
          if (iTable < uVar2) {
            uVar13 = uVar2;
          }
          if (uVar2 <= uVar6) {
            iTable = uVar13;
          }
        }
        if (iTable == 0) break;
        if (pTab->pSchema == (Schema *)0x0) {
          iVar12 = -0x8000;
        }
        else {
          iVar12 = -1;
          ppSVar11 = &pParse->db->aDb->pSchema;
          do {
            iVar12 = iVar12 + 1;
            pSVar8 = *ppSVar11;
            ppSVar11 = ppSVar11 + 4;
          } while (pSVar8 != pTab->pSchema);
        }
        destroyRootPage(pParse,iTable,iVar12);
      }
      uVar5 = pTab->eTabType;
      goto LAB_0019467f;
    }
  }
  else {
LAB_0019467f:
    if (uVar5 != '\x01') goto LAB_001946c6;
  }
  pcVar4 = pTab->zName;
  iVar12 = sqlite3VdbeAddOp3(p,0xac,iDb,0,0);
  sqlite3VdbeChangeP4(p,iVar12,pcVar4,0);
  pPVar7 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar7 = pParse;
  }
  pPVar7->mayAbort = '\x01';
LAB_001946c6:
  pcVar4 = pTab->zName;
  iVar12 = sqlite3VdbeAddOp3(p,0x97,iDb,0,0);
  sqlite3VdbeChangeP4(p,iVar12,pcVar4,0);
  sqlite3VdbeAddOp3(pParse->pVdbe,100,iDb,1,(pParse->db->aDb[iDb].pSchema)->schema_cookie + 1);
  pSVar8 = db->aDb[iDb].pSchema;
  uVar9 = pSVar8->schemaFlags;
  if ((uVar9 & 2) != 0) {
    pHVar14 = (pSVar8->tblHash).first;
    if (pHVar14 != (HashElem *)0x0) {
      do {
        if (((Table *)pHVar14->data)->eTabType == '\x02') {
          sqlite3DeleteColumnNames(db,(Table *)pHVar14->data);
        }
        pHVar14 = pHVar14->next;
      } while (pHVar14 != (HashElem *)0x0);
      pSVar8 = db->aDb[iDb].pSchema;
      uVar9 = pSVar8->schemaFlags;
    }
    pSVar8->schemaFlags = uVar9 & 0xfffd;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeDropTable(Parse *pParse, Table *pTab, int iDb, int isView){
  Vdbe *v;
  sqlite3 *db = pParse->db;
  Trigger *pTrigger;
  Db *pDb = &db->aDb[iDb];

  v = sqlite3GetVdbe(pParse);
  assert( v!=0 );
  sqlite3BeginWriteOperation(pParse, 1, iDb);

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pTab) ){
    sqlite3VdbeAddOp0(v, OP_VBegin);
  }
#endif

  /* Drop all triggers associated with the table being dropped. Code
  ** is generated to remove entries from sqlite_schema and/or
  ** sqlite_temp_schema if required.
  */
  pTrigger = sqlite3TriggerList(pParse, pTab);
  while( pTrigger ){
    assert( pTrigger->pSchema==pTab->pSchema ||
        pTrigger->pSchema==db->aDb[1].pSchema );
    sqlite3DropTriggerPtr(pParse, pTrigger);
    pTrigger = pTrigger->pNext;
  }

#ifndef SQLITE_OMIT_AUTOINCREMENT
  /* Remove any entries of the sqlite_sequence table associated with
  ** the table being dropped. This is done before the table is dropped
  ** at the btree level, in case the sqlite_sequence table needs to
  ** move as a result of the drop (can happen in auto-vacuum mode).
  */
  if( pTab->tabFlags & TF_Autoincrement ){
    sqlite3NestedParse(pParse,
      "DELETE FROM %Q.sqlite_sequence WHERE name=%Q",
      pDb->zDbSName, pTab->zName
    );
  }
#endif

  /* Drop all entries in the schema table that refer to the
  ** table. The program name loops through the schema table and deletes
  ** every row that refers to a table of the same name as the one being
  ** dropped. Triggers are handled separately because a trigger can be
  ** created in the temp database that refers to a table in another
  ** database.
  */
  sqlite3NestedParse(pParse,
      "DELETE FROM %Q." LEGACY_SCHEMA_TABLE
      " WHERE tbl_name=%Q and type!='trigger'",
      pDb->zDbSName, pTab->zName);
  if( !isView && !IsVirtual(pTab) ){
    destroyTable(pParse, pTab);
  }

  /* Remove the table entry from SQLite's internal schema and modify
  ** the schema cookie.
  */
  if( IsVirtual(pTab) ){
    sqlite3VdbeAddOp4(v, OP_VDestroy, iDb, 0, 0, pTab->zName, 0);
    sqlite3MayAbort(pParse);
  }
  sqlite3VdbeAddOp4(v, OP_DropTable, iDb, 0, 0, pTab->zName, 0);
  sqlite3ChangeCookie(pParse, iDb);
  sqliteViewResetAll(db, iDb);
}